

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O1

void progressRateFR(Real *q_f,Real *q_r,Real *sc,Real T)

{
  int i;
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_f8;
  double dStack_f0;
  double local_98;
  double dStack_90;
  double local_78;
  double dStack_70;
  
  dVar2 = log(T);
  dVar3 = T * T;
  *q_f = sc[1] * sc[3];
  *q_r = sc[6];
  q_f[1] = sc[7];
  q_r[1] = sc[5] * sc[5];
  q_f[2] = *sc;
  q_r[2] = sc[3] * sc[3];
  q_f[3] = sc[4] * sc[4];
  q_r[3] = sc[1];
  q_f[4] = sc[3] * sc[4];
  q_r[4] = sc[5];
  q_f[5] = sc[3] * sc[5];
  q_r[5] = sc[2];
  q_f[6] = sc[1] * sc[3];
  q_r[6] = sc[4] * sc[5];
  q_f[7] = *sc * sc[4];
  q_r[7] = sc[3] * sc[5];
  q_f[8] = *sc * sc[5];
  q_r[8] = sc[2] * sc[3];
  q_f[9] = sc[2] * sc[4];
  q_r[9] = sc[5] * sc[5];
  q_f[10] = sc[3] * sc[6];
  q_r[10] = *sc * sc[1];
  dVar6 = dVar3 * T;
  q_f[0xb] = sc[3] * sc[6];
  q_r[0xb] = sc[5] * sc[5];
  q_f[0xc] = sc[4] * sc[6];
  q_r[0xc] = sc[1] * sc[5];
  q_f[0xd] = sc[5] * sc[6];
  q_r[0xd] = sc[1] * sc[2];
  q_f[0xe] = sc[6] * sc[6];
  q_r[0xe] = sc[1] * sc[7];
  q_f[0xf] = sc[6] * sc[6];
  q_r[0xf] = sc[1] * sc[7];
  q_f[0x10] = sc[3] * sc[7];
  q_r[0x10] = sc[2] * sc[5];
  q_f[0x11] = sc[3] * sc[7];
  q_r[0x11] = *sc * sc[6];
  q_f[0x12] = sc[4] * sc[7];
  q_r[0x12] = sc[5] * sc[6];
  q_f[0x13] = sc[5] * sc[7];
  q_r[0x13] = sc[2] * sc[6];
  q_f[0x14] = sc[5] * sc[7];
  dVar12 = 1.0 / T;
  q_r[0x14] = sc[2] * sc[6];
  dVar9 = 0.0;
  lVar1 = 0;
  do {
    dVar9 = dVar9 + sc[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 9);
  dVar13 = dVar6 * T;
  if (1000.0 <= T) {
    dVar10 = dVar6 * -1.479401233333333e-12 +
             dVar3 * 2.098069983333333e-08 +
             T * -0.0003067598445 + dVar2 * -3.69757819 + dVar12 * -1233.93018 + 0.5084126000000002;
    dVar11 = dVar6 * -1.000830325e-11 +
             dVar3 * 1.455043351666667e-07 +
             T * -0.001528146445 + dVar2 * -2.67214561 + dVar12 * -29899.209 + -4.190671200000001;
    local_f8 = dVar13 * 5.39542675e-16 +
               dVar6 * -9.520530833333334e-12 +
               dVar3 * 1.056096916666667e-07 +
               T * -0.001119910065 + dVar2 * -4.0172109 + dVar12 * 111.856713 + 0.2321087500000001;
    dStack_f0 = dVar13 * 6.6597938e-17 +
                dVar6 * -2.54348895e-12 +
                dVar3 * 4.318045966666667e-08 +
                T * -0.00052825224 + dVar2 * -2.86472886 + dVar12 * 3683.62875 + -2.83691187;
    local_98 = dVar13 * 2.18402575e-17 +
               dVar6 * -3.792556183333333e-13 +
               dVar3 * 5.171338916666667e-10 +
               T * 1.377530955e-05 + dVar2 * -2.54205966 + dVar12 * 29230.8027 + -2.37824845;
    dStack_90 = dVar13 * -0.0 +
                dVar6 * -0.0 +
                dVar3 * -0.0 + T * -0.0 + dVar2 * -2.5 + dVar12 * 25471.627 + 2.960117638;
    local_78 = dVar13 * -7.91375895e-17 +
               dVar6 * 7.692981816666667e-13 +
               dVar3 * 9.389714483333333e-09 +
               T * -0.0003500322055 + dVar2 * -2.99142337 + dVar12 * -835.033997 + 4.34653354;
    dStack_70 = dVar13 * 7.1582678e-16 +
                dVar6 * -1.957419641666667e-11 +
                dVar3 * 2.4578147e-07 +
                T * -0.002168068195 + dVar2 * -4.57316685 + dVar12 * -18006.9609 + 4.072029891;
    dVar3 = 5.68217655e-17;
    dVar6 = 3.195808935e-16;
  }
  else {
    dVar10 = dVar6 * -1.094897691666667e-10 +
             dVar3 * 9.593584116666666e-08 +
             T * -0.000563743175 + dVar2 * -3.2129364 + dVar12 * -1005.24902 + -2.82180119;
    dVar11 = dVar6 * -5.807151058333333e-10 +
             dVar3 * 1.059116055e-06 +
             T * -0.00173749123 + dVar2 * -3.38684249 + dVar12 * -30208.1133 + 0.7966096399999998;
    local_f8 = dVar13 * -4.646125620000001e-13 +
               dVar6 * 2.02303245e-09 +
               dVar3 * -3.526381516666666e-06 +
               T * 0.002374560255 + dVar2 * -4.30179801 + dVar12 * 294.80804 + 0.5851355599999999;
    dStack_f0 = dVar13 * -1.031186895e-13 +
                dVar6 * 4.832113691666666e-10 +
                dVar3 * -1.087941151666667e-06 +
                T * 0.001612724695 + dVar2 * -4.12530561 + dVar12 * 3346.30913 + 4.81573857;
    local_98 = dVar13 * -1.94534818e-14 +
               dVar6 * 1.335702658333333e-10 +
               dVar3 * -4.035052833333333e-07 +
               T * 0.000819083245 + dVar2 * -2.94642878 + dVar12 * 29147.6445 + -0.01756619999999964
    ;
    dStack_90 = dVar13 * -0.0 +
                dVar6 * -0.0 +
                dVar3 * -0.0 + T * -0.0 + dVar2 * -2.5 + dVar12 * 25471.627 + 2.960117608;
    local_78 = dVar13 * -2.06743612e-14 +
               dVar6 * 7.896195275e-12 +
               dVar3 * 1.357169215e-07 +
               T * -0.000412472087 + dVar2 * -3.29812431 + dVar12 * -1012.52087 + 6.5922184;
    dStack_70 = dVar13 * -1.235757375e-13 +
                dVar6 * 3.854837933333333e-10 +
                dVar3 * 2.475020966666667e-08 +
                T * -0.003284612905 + dVar2 * -3.38875365 + dVar12 * -17663.1465 + -3.39660955;
    dVar3 = 4.38427696e-14;
    dVar6 = 1.253294235e-13;
  }
  dVar10 = dVar13 * dVar3 + dVar10;
  dVar11 = dVar13 * dVar6 + dVar11;
  dVar7 = dVar12 * 12186.6002121605;
  dVar3 = exp(dVar2 * -0.406 + dVar12 * -8352.89343569254);
  q_f[6] = q_f[6] * dVar3 * 3547000000.0;
  dVar6 = exp(-(((dVar10 + dStack_90) - local_98) - dStack_f0));
  q_r[6] = dVar6 * dVar3 * 3547000000.0 * q_r[6];
  dVar3 = exp(dVar2 * 2.67 + dVar12 * -3165.23282791169);
  q_f[7] = q_f[7] * dVar3 * 0.0508;
  dVar6 = exp(-(((local_78 - dStack_90) + local_98) - dStack_f0));
  q_r[7] = dVar6 * dVar3 * 0.0508 * q_r[7];
  dVar3 = exp(dVar2 * 1.51 + dVar12 * -1726.03316371019);
  q_f[8] = q_f[8] * dVar3 * 216.0;
  dVar6 = exp(-(((local_78 - dVar11) - dStack_90) + dStack_f0));
  q_r[8] = dVar6 * dVar3 * 216.0 * q_r[8];
  dVar3 = exp(dVar2 * 2.02 + dVar12 * -6743.10332178324);
  q_f[9] = q_f[9] * dVar3 * 2.97;
  dVar8 = dStack_f0 * -2.0;
  dVar6 = exp(-(dVar11 + local_98 + dVar8));
  q_r[9] = dVar6 * dVar3 * 2.97 * q_r[9];
  dVar3 = exp(dVar2 * -1.4 + dVar12 * -52525.7555766966);
  dVar6 = (sc[2] * 11.0 + *sc * 1.5 + dVar9) * dVar3 * 45770000000000.0;
  q_f[2] = q_f[2] * dVar6;
  dVar3 = exp(-(local_78 - (dStack_90 + dStack_90)));
  q_r[2] = dVar3 * dVar6 * (1.0 / dVar7) * q_r[2];
  dVar3 = exp(dVar2 * -0.5);
  dVar6 = (sc[2] * 11.0 + *sc * 1.5 + dVar9) * dVar3 * 6165.0;
  q_f[3] = q_f[3] * dVar6;
  dVar3 = exp(-((local_98 + local_98) - dVar10));
  q_r[3] = dVar3 * dVar6 * dVar7 * q_r[3];
  dVar3 = exp(-dVar2);
  dVar6 = (sc[2] * 11.0 + *sc * 1.5 + dVar9) * dVar3 * 4714000.0;
  q_f[4] = q_f[4] * dVar6;
  dVar3 = exp(-((dStack_90 + local_98) - dStack_f0));
  q_r[4] = dVar3 * dVar6 * dVar7 * q_r[4];
  dVar3 = exp(dVar2 * -2.0);
  dVar6 = (sc[2] * 11.0 + *sc * 1.5 + dVar9) * dVar3 * 38000000000.0;
  q_f[5] = q_f[5] * dVar6;
  dVar3 = exp(-((dStack_90 - dVar11) + dStack_f0));
  q_r[5] = dVar3 * dVar6 * dVar7 * q_r[5];
  dVar4 = exp(dVar2 * 0.6);
  dVar3 = *sc;
  dVar6 = sc[1];
  dVar13 = sc[2];
  dVar5 = exp(dVar2 * -1.72 + dVar12 * -264.08810621431707);
  dVar5 = dVar5 * ((dVar13 * 10.0 + dVar6 * -0.22 + dVar3 + dVar9) / (dVar4 * 1475000.0)) * 1e-12 *
                  6.366e+20;
  dVar13 = log10(dVar5);
  dVar3 = exp(T * -1e+30);
  dVar6 = exp(T * -1e-30);
  dVar3 = log10(dVar6 * 0.8 + dVar3 * 0.2 + 0.0);
  dVar13 = dVar3 * -0.67 + -0.4 + dVar13;
  dVar13 = dVar13 / (dVar13 * -0.14 + dVar3 * -1.27 + 0.75);
  dVar3 = pow(10.0,dVar3 / (dVar13 * dVar13 + 1.0));
  dVar3 = dVar3 * (dVar5 / (dVar5 + 1.0)) * dVar4 * 1475000.0;
  *q_f = *q_f * dVar3;
  dVar6 = exp(-((dVar10 + dStack_90) - local_f8));
  *q_r = dVar6 * dVar3 * dVar7 * *q_r;
  dVar3 = exp(dVar12 * -414.147315957284);
  q_f[10] = q_f[10] * dVar3 * 16600000.0;
  dVar6 = exp(-((-local_78 - dVar10) + dStack_90 + local_f8));
  q_r[10] = dVar6 * dVar3 * 16600000.0 * q_r[10];
  dVar3 = exp(dVar12 * -148.448916412392);
  q_f[0xb] = q_f[0xb] * dVar3 * 70790000.0;
  dVar6 = exp(-(dVar8 + dStack_90 + local_f8));
  q_r[0xb] = dVar6 * dVar3 * 70790000.0 * q_r[0xb];
  q_f[0xc] = q_f[0xc] * 32500000.0;
  dVar3 = exp(-(((local_98 - dVar10) - dStack_f0) + local_f8));
  q_r[0xc] = dVar3 * 32500000.0 * q_r[0xc];
  dVar3 = exp(dVar12 * 250.098682904946);
  q_f[0xd] = q_f[0xd] * dVar3 * 28900000.0;
  dVar6 = exp(-((-dVar10 - dVar11) + dStack_f0 + local_f8));
  q_r[0xd] = dVar6 * dVar3 * 28900000.0 * q_r[0xd];
  dVar3 = exp(dVar12 * -6029.54208967215);
  q_f[0xe] = q_f[0xe] * dVar3 * 420000000.0;
  dVar6 = -(((local_f8 + local_f8) - dVar10) - dStack_70);
  dVar13 = exp(dVar6);
  q_r[0xe] = dVar13 * dVar3 * 420000000.0 * q_r[0xe];
  dVar3 = exp(dVar12 * 819.89091359563);
  q_f[0xf] = q_f[0xf] * dVar3 * 130000.0;
  dVar6 = exp(dVar6);
  q_r[0xf] = dVar6 * dVar3 * 130000.0 * q_r[0xf];
  dVar13 = exp(dVar12 * -24370.7831249226);
  dVar3 = *sc;
  dVar6 = sc[2];
  dVar10 = exp(dVar2 * 0.0 + dVar12 * -22896.35829411476);
  dVar10 = dVar10 * ((dVar6 * 11.0 + dVar3 * 1.5 + dVar9) / (dVar13 * 295100000000000.0)) * 1e-06 *
                    1.202e+17;
  dVar9 = log10(dVar10);
  dVar3 = exp(T * -1e+30);
  dVar6 = exp(T * -1e-30);
  dVar3 = log10(dVar6 * 0.5 + dVar3 * 0.5 + 0.0);
  dVar9 = dVar3 * -0.67 + -0.4 + dVar9;
  dVar9 = dVar9 / (dVar9 * -0.14 + dVar3 * -1.27 + 0.75);
  dVar3 = pow(10.0,dVar3 / (dVar9 * dVar9 + 1.0));
  dVar3 = dVar3 * (dVar10 / (dVar10 + 1.0)) * dVar13 * 295100000000000.0;
  q_f[1] = q_f[1] * dVar3;
  dVar6 = exp(-(dVar8 + dStack_70));
  q_r[1] = dVar6 * dVar3 * (1.0 / dVar7) * q_r[1];
  dVar3 = exp(dVar12 * -1997.77016324474);
  q_f[0x10] = q_f[0x10] * dVar3 * 24100000.0;
  dVar6 = exp(-(((dStack_90 - dVar11) - dStack_f0) + dStack_70));
  q_r[0x10] = dVar6 * dVar3 * 24100000.0 * q_r[0x10];
  dVar3 = exp(dVar12 * -4000.57249314752);
  q_f[0x11] = q_f[0x11] * dVar3 * 48200000.0;
  dVar6 = exp(-(((dStack_90 - local_78) - local_f8) + dStack_70));
  q_r[0x11] = dVar6 * dVar3 * 48200000.0 * q_r[0x11];
  dVar2 = exp(dVar2 + dVar2 + dVar12 * -1997.77016324474);
  q_f[0x12] = q_f[0x12] * dVar2 * 9.55;
  dVar3 = exp(-(((local_98 - dStack_f0) - local_f8) + dStack_70));
  q_r[0x12] = dVar3 * dVar2 * 9.55 * q_r[0x12];
  q_f[0x13] = q_f[0x13] * 1000000.0;
  dVar2 = -(((dStack_f0 - dVar11) - local_f8) + dStack_70);
  dVar3 = exp(dVar2);
  q_r[0x13] = dVar3 * 1000000.0 * q_r[0x13];
  dVar3 = exp(dVar12 * -4809.24167509571);
  q_f[0x14] = q_f[0x14] * dVar3 * 580000000.0;
  dVar2 = exp(dVar2);
  q_r[0x14] = dVar2 * dVar3 * 580000000.0 * q_r[0x14];
  return;
}

Assistant:

void
progressRateFR(
  amrex::Real* q_f, amrex::Real* q_r, amrex::Real* sc, amrex::Real T)
{
  const amrex::Real tc[5] = {
    log(T), T, T * T, T * T * T, T * T * T * T}; // temperature cache
  amrex::Real invT = 1.0 / tc[1];
  // compute the Gibbs free energy
  amrex::Real g_RT[9];
  gibbs(g_RT, tc);

  amrex::Real sc_qss[1];
  amrex::Real kf_qss[0], qf_qss[0], qr_qss[0];
  comp_qfqr(q_f, q_r, sc, sc_qss, tc, invT);

  return;
}